

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.cc
# Opt level: O0

bool xemmai::t_type_of<long>::f__greater(intptr_t a_self,t_pvalue *a_value)

{
  bool bVar1;
  uintptr_t uVar2;
  t_object *a_object;
  long *plVar3;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar4;
  wstring_view a_message;
  xemmai *local_38;
  t_object *p;
  t_pvalue *a_value_local;
  intptr_t a_self_local;
  
  uVar2 = t_value<xemmai::t_pointer>::f_tag(a_value);
  if (uVar2 == 3) {
    a_self_local._7_1_ = (a_value->field_0).v_integer < a_self;
  }
  else if (uVar2 == 4) {
    a_self_local._7_1_ =
         (a_value->field_0).v_float <= (double)a_self &&
         (double)a_self != (a_value->field_0).v_float;
  }
  else {
    a_object = t_pointer::operator_cast_to_t_object_(&a_value->super_t_pointer);
    bVar1 = f_is<long>(a_object);
    if (!bVar1) {
      bVar4 = sv(L"not supported.",0xe);
      a_message._M_str = bVar4._M_str;
      local_38 = (xemmai *)bVar4._M_len;
      a_message._M_len = (size_t)a_message._M_str;
      f_throw(local_38,a_message);
    }
    plVar3 = t_object::f_as<long>(a_object);
    a_self_local._7_1_ = *plVar3 < a_self;
  }
  return a_self_local._7_1_;
}

Assistant:

bool t_type_of<intptr_t>::f__greater(intptr_t a_self, const t_pvalue& a_value)
{
	switch (a_value.f_tag()) {
	case c_tag__INTEGER:
		return a_self > a_value.v_integer;
	case c_tag__FLOAT:
		return a_self > a_value.v_float;
	}
	t_object* p = a_value;
	if (f_is<intptr_t>(p)) return a_self > p->f_as<intptr_t>();
	f_throw(L"not supported."sv);
}